

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

bool __thiscall glslang::TQualifier::bufferReferenceNeedsVulkanMemoryModel(TQualifier *this)

{
  bool local_11;
  TQualifier *this_local;
  
  local_11 = true;
  if (((((*(ulong *)&this->field_0x8 >> 0x37 & 1) == 0) &&
       (local_11 = true, (*(ulong *)&this->field_0x8 >> 0x36 & 1) == 0)) &&
      (local_11 = true, (*(ulong *)&this->field_0x8 >> 0x35 & 1) == 0)) &&
     ((local_11 = true, (*(ulong *)&this->field_0x8 >> 0x34 & 1) == 0 &&
      (local_11 = true, (*(ulong *)&this->field_0x8 >> 0x31 & 1) == 0)))) {
    local_11 = (bool)((byte)((ulong)*(undefined8 *)&this->field_0x8 >> 0x39) & 1);
  }
  return local_11;
}

Assistant:

bool bufferReferenceNeedsVulkanMemoryModel() const
    {
        // include qualifiers that map to load/store availability/visibility/nonprivate memory access operands
        return subgroupcoherent || workgroupcoherent || queuefamilycoherent || devicecoherent || coherent || nonprivate;
    }